

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O0

void c219_alloc_rom(void *chip,UINT32 memsize)

{
  UINT32 UVar1;
  void *pvVar2;
  c219_state *info;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 0xc) != memsize) {
    pvVar2 = realloc(*(void **)((long)chip + 0x18),(ulong)memsize);
    *(void **)((long)chip + 0x18) = pvVar2;
    *(UINT32 *)((long)chip + 0xc) = memsize;
    UVar1 = pow2_mask(memsize);
    *(UINT32 *)((long)chip + 0x10) = UVar1;
    memset(*(void **)((long)chip + 0x18),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void c219_alloc_rom(void* chip, UINT32 memsize)
{
	c219_state *info = (c219_state *)chip;
	
	if (info->pRomSize == memsize)
		return;
	
	info->pRom = (UINT8*)realloc(info->pRom, memsize);
	info->pRomSize = memsize;
	info->pRomMask = pow2_mask(memsize);
	memset(info->pRom, 0xFF, memsize);
	
	return;
}